

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataDictionary.cpp
# Opt level: O3

void __thiscall FIX::DataDictionary::readFromDocument(DataDictionary *this,DOMDocumentPtr *pDoc)

{
  char cVar1;
  int iVar2;
  Type type_00;
  int iVar3;
  long *plVar4;
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  *this_00;
  _Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *this_01;
  ConfigError *pCVar5;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar6;
  ulong *puVar7;
  size_type *psVar8;
  DOMDocument *pDVar9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pDoc_00;
  _Alloc_hider _Var10;
  DataDictionary *pDVar11;
  bool bVar12;
  string name;
  string number;
  string type_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string description;
  string type;
  string major;
  string minor;
  string local_1b0;
  string local_190;
  string local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_130;
  string local_128;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_108;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_100;
  DataDictionary *local_f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_f0;
  DOMDocumentPtr *local_e8;
  string local_e0;
  string local_c0;
  string local_a0;
  long *local_80;
  long *local_78 [2];
  long local_68 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_58;
  FieldToValue *local_50;
  long *local_48;
  long *local_40;
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  *local_38;
  
  pDVar9 = (pDoc->_M_t).
           super___uniq_ptr_impl<FIX::DOMDocument,_std::default_delete<FIX::DOMDocument>_>._M_t.
           super__Tuple_impl<0UL,_FIX::DOMDocument_*,_std::default_delete<FIX::DOMDocument>_>.
           super__Head_base<0UL,_FIX::DOMDocument_*,_false>._M_head_impl;
  local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
  local_e8 = pDoc;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0,"/fix","");
  (*pDVar9->_vptr_DOMDocument[5])(&local_40,pDVar9,&local_e0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
    operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
  }
  if (local_40 == (long *)0x0) {
    pCVar5 = (ConfigError *)__cxa_allocate_exception(0x50);
    local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_e0,
               "Could not parse data dictionary file, or no <fix> node found at root","");
    ConfigError::ConfigError(pCVar5,&local_e0);
    __cxa_throw(pCVar5,&ConfigError::typeinfo,FIX::Exception::~Exception);
  }
  (**(code **)(*local_40 + 0x20))(&local_80);
  local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0,"FIX","");
  plVar4 = local_80;
  local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"type","");
  cVar1 = (**(code **)(*plVar4 + 0x10))(plVar4,&local_c0,&local_e0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
    operator_delete(local_c0._M_dataplus._M_p,
                    CONCAT71(local_c0.field_2._M_allocated_capacity._1_7_,
                             local_c0.field_2._M_local_buf[0]) + 1);
  }
  if (((cVar1 != '\0') && (iVar2 = std::__cxx11::string::compare((char *)&local_e0), iVar2 != 0)) &&
     (iVar2 = std::__cxx11::string::compare((char *)&local_e0), iVar2 != 0)) {
    pCVar5 = (ConfigError *)__cxa_allocate_exception(0x50);
    local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_c0,"type attribute must be FIX or FIXT","");
    ConfigError::ConfigError(pCVar5,&local_c0);
    __cxa_throw(pCVar5,&ConfigError::typeinfo,FIX::Exception::~Exception);
  }
  plVar4 = local_80;
  local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
  local_c0._M_string_length = 0;
  local_c0.field_2._M_local_buf[0] = '\0';
  local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"major","");
  cVar1 = (**(code **)(*plVar4 + 0x10))(plVar4,&local_a0,&local_c0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p,
                    CONCAT71(local_a0.field_2._M_allocated_capacity._1_7_,
                             local_a0.field_2._M_local_buf[0]) + 1);
  }
  plVar4 = local_80;
  if (cVar1 == '\0') {
    pCVar5 = (ConfigError *)__cxa_allocate_exception(0x50);
    local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_a0,"major attribute not found on <fix>","");
    ConfigError::ConfigError(pCVar5,&local_a0);
    __cxa_throw(pCVar5,&ConfigError::typeinfo,FIX::Exception::~Exception);
  }
  local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
  local_a0._M_string_length = 0;
  local_a0.field_2._M_local_buf[0] = '\0';
  local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b0,"minor","");
  cVar1 = (**(code **)(*plVar4 + 0x10))(plVar4,&local_1b0,&local_a0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
    operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity + 1);
  }
  if (cVar1 == '\0') {
    pCVar5 = (ConfigError *)__cxa_allocate_exception(0x50);
    local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_1b0,"minor attribute not found on <fix>","");
    ConfigError::ConfigError(pCVar5,&local_1b0);
    __cxa_throw(pCVar5,&ConfigError::typeinfo,FIX::Exception::~Exception);
  }
  local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_150,local_e0._M_dataplus._M_p,
             local_e0._M_dataplus._M_p + local_e0._M_string_length);
  std::__cxx11::string::append((char *)&local_150);
  plVar4 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_150,(ulong)local_c0._M_dataplus._M_p);
  local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
  paVar6 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(plVar4 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar4 == paVar6) {
    local_170.field_2._M_allocated_capacity = paVar6->_M_allocated_capacity;
    local_170.field_2._8_8_ = plVar4[3];
  }
  else {
    local_170.field_2._M_allocated_capacity = paVar6->_M_allocated_capacity;
    local_170._M_dataplus._M_p = (pointer)*plVar4;
  }
  local_170._M_string_length = plVar4[1];
  *plVar4 = (long)paVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_170);
  local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
  puVar7 = (ulong *)(plVar4 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar4 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar7) {
    local_190.field_2._M_allocated_capacity = *puVar7;
    local_190.field_2._8_8_ = plVar4[3];
  }
  else {
    local_190.field_2._M_allocated_capacity = *puVar7;
    local_190._M_dataplus._M_p = (pointer)*plVar4;
  }
  local_190._M_string_length = plVar4[1];
  *plVar4 = (long)puVar7;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_190,(ulong)local_a0._M_dataplus._M_p);
  local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
  paVar6 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(plVar4 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar4 == paVar6) {
    local_1b0.field_2._M_allocated_capacity = paVar6->_M_allocated_capacity;
    local_1b0.field_2._8_8_ = plVar4[3];
  }
  else {
    local_1b0.field_2._M_allocated_capacity = paVar6->_M_allocated_capacity;
    local_1b0._M_dataplus._M_p = (pointer)*plVar4;
  }
  local_1b0._M_string_length = plVar4[1];
  *plVar4 = (long)paVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  setVersion(this,&local_1b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
    operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_190._M_dataplus._M_p != &local_190.field_2) {
    operator_delete(local_190._M_dataplus._M_p,local_190.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_170._M_dataplus._M_p != &local_170.field_2) {
    operator_delete(local_170._M_dataplus._M_p,local_170.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150._M_dataplus._M_p != &local_150.field_2) {
    operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
  }
  pDVar9 = (local_e8->_M_t).
           super___uniq_ptr_impl<FIX::DOMDocument,_std::default_delete<FIX::DOMDocument>_>._M_t.
           super__Tuple_impl<0UL,_FIX::DOMDocument_*,_std::default_delete<FIX::DOMDocument>_>.
           super__Head_base<0UL,_FIX::DOMDocument_*,_false>._M_head_impl;
  local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b0,"/fix/fields","");
  (*pDVar9->_vptr_DOMDocument[5])(&local_48,pDVar9,&local_1b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
    operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity + 1);
  }
  if (local_48 == (long *)0x0) {
    pCVar5 = (ConfigError *)__cxa_allocate_exception(0x50);
    local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_1b0,"<fields> section not found in data dictionary","");
    ConfigError::ConfigError(pCVar5,&local_1b0);
    __cxa_throw(pCVar5,&ConfigError::typeinfo,FIX::Exception::~Exception);
  }
  (**(code **)(*local_48 + 0x10))(&local_f0);
  if (local_f0 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    pCVar5 = (ConfigError *)__cxa_allocate_exception(0x50);
    local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b0,"No fields defined","");
    ConfigError::ConfigError(pCVar5,&local_1b0);
    __cxa_throw(pCVar5,&ConfigError::typeinfo,FIX::Exception::~Exception);
  }
  local_50 = &this->m_fieldValues;
  local_f8 = this;
  do {
    (**(code **)(local_f0->_M_allocated_capacity + 0x28))(&local_1b0);
    iVar2 = std::__cxx11::string::compare((char *)&local_1b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
      operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity + 1);
    }
    if (iVar2 == 0) {
      (**(code **)(local_f0->_M_allocated_capacity + 0x20))(&local_108);
      paVar6 = local_108;
      local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
      local_1b0._M_string_length = 0;
      local_1b0.field_2._M_allocated_capacity =
           local_1b0.field_2._M_allocated_capacity & 0xffffffffffffff00;
      local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_190,"name","");
      cVar1 = (**(code **)(paVar6->_M_allocated_capacity + 0x10))(paVar6,&local_190,&local_1b0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_190._M_dataplus._M_p != &local_190.field_2) {
        operator_delete(local_190._M_dataplus._M_p,local_190.field_2._M_allocated_capacity + 1);
      }
      paVar6 = local_108;
      if (cVar1 == '\0') {
        pCVar5 = (ConfigError *)__cxa_allocate_exception(0x50);
        local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_190,"<field> does not have a name attribute","");
        ConfigError::ConfigError(pCVar5,&local_190);
        __cxa_throw(pCVar5,&ConfigError::typeinfo,FIX::Exception::~Exception);
      }
      local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
      local_190._M_string_length = 0;
      local_190.field_2._M_allocated_capacity =
           local_190.field_2._M_allocated_capacity & 0xffffffffffffff00;
      local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_170,"number","");
      cVar1 = (**(code **)(paVar6->_M_allocated_capacity + 0x10))(paVar6,&local_170,&local_190);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_170._M_dataplus._M_p != &local_170.field_2) {
        operator_delete(local_170._M_dataplus._M_p,local_170.field_2._M_allocated_capacity + 1);
      }
      if (cVar1 == '\0') {
        pCVar5 = (ConfigError *)__cxa_allocate_exception(0x50);
        std::operator+(&local_150,"<field> ",&local_1b0);
        plVar4 = (long *)std::__cxx11::string::append((char *)&local_150);
        local_170._M_dataplus._M_p = (pointer)*plVar4;
        paVar6 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)(plVar4 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_170._M_dataplus._M_p == paVar6) {
          local_170.field_2._M_allocated_capacity = paVar6->_M_allocated_capacity;
          local_170.field_2._8_8_ = plVar4[3];
          local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
        }
        else {
          local_170.field_2._M_allocated_capacity = paVar6->_M_allocated_capacity;
        }
        local_170._M_string_length = plVar4[1];
        *plVar4 = (long)paVar6;
        plVar4[1] = 0;
        *(undefined1 *)(plVar4 + 2) = 0;
        ConfigError::ConfigError(pCVar5,&local_170);
        __cxa_throw(pCVar5,&ConfigError::typeinfo,FIX::Exception::~Exception);
      }
      iVar2 = atoi(local_190._M_dataplus._M_p);
      paVar6 = local_108;
      local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
      local_170._M_string_length = 0;
      local_170.field_2._M_allocated_capacity =
           local_170.field_2._M_allocated_capacity & 0xffffffffffffff00;
      local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_150,"type","");
      cVar1 = (**(code **)(paVar6->_M_allocated_capacity + 0x10))(paVar6,&local_150,&local_170);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_150._M_dataplus._M_p != &local_150.field_2) {
        operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
      }
      pDVar11 = local_f8;
      if (cVar1 == '\0') {
        pCVar5 = (ConfigError *)__cxa_allocate_exception(0x50);
        std::operator+(&local_128,"<field> ",&local_1b0);
        plVar4 = (long *)std::__cxx11::string::append((char *)&local_128);
        local_150._M_dataplus._M_p = (pointer)*plVar4;
        psVar8 = (size_type *)(plVar4 + 2);
        if ((size_type *)local_150._M_dataplus._M_p == psVar8) {
          local_150.field_2._M_allocated_capacity = *psVar8;
          local_150.field_2._8_8_ = plVar4[3];
          local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
        }
        else {
          local_150.field_2._M_allocated_capacity = *psVar8;
        }
        local_150._M_string_length = plVar4[1];
        *plVar4 = (long)psVar8;
        plVar4[1] = 0;
        *(undefined1 *)(plVar4 + 2) = 0;
        ConfigError::ConfigError(pCVar5,&local_150);
        __cxa_throw(pCVar5,&ConfigError::typeinfo,FIX::Exception::~Exception);
      }
      addField(local_f8,iVar2);
      type_00 = XMLTypeToType(pDVar11,&local_170);
      addFieldType(pDVar11,iVar2,type_00);
      addFieldName(pDVar11,iVar2,&local_1b0);
      (**(code **)(local_f0->_M_allocated_capacity + 0x10))(&local_100);
      while (local_100 !=
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x0) {
        (**(code **)(local_100->_M_allocated_capacity + 0x28))(&local_150);
        iVar3 = std::__cxx11::string::compare((char *)&local_150);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_150._M_dataplus._M_p != &local_150.field_2) {
          operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
        }
        if (iVar3 == 0) {
          (**(code **)(local_100->_M_allocated_capacity + 0x20))(&local_130);
          paVar6 = local_130;
          local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
          local_150._M_string_length = 0;
          local_150.field_2._M_allocated_capacity =
               local_150.field_2._M_allocated_capacity & 0xffffffffffffff00;
          local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_128,"enum","");
          iVar3 = (**(code **)(paVar6->_M_allocated_capacity + 0x10))(paVar6,&local_128,&local_150);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_128._M_dataplus._M_p != &local_128.field_2) {
            operator_delete(local_128._M_dataplus._M_p,
                            CONCAT71(local_128.field_2._M_allocated_capacity._1_7_,
                                     local_128.field_2._M_local_buf[0]) + 1);
          }
          if ((char)iVar3 == '\0') {
            pCVar5 = (ConfigError *)__cxa_allocate_exception(0x50);
            std::operator+(&local_128,"<value> does not have enum attribute in field ",&local_1b0);
            ConfigError::ConfigError(pCVar5,&local_128);
            __cxa_throw(pCVar5,&ConfigError::typeinfo,FIX::Exception::~Exception);
          }
          local_128._M_dataplus._M_p._0_4_ = iVar2;
          this_00 = (_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                     *)std::
                       map<int,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                       ::operator[](local_50,(key_type *)&local_128);
          std::
          _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
          ::_M_insert_unique<std::__cxx11::string_const&>(this_00,&local_150);
          paVar6 = local_130;
          local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
          local_128._M_string_length = 0;
          local_128.field_2._M_local_buf[0] = '\0';
          local_78[0] = local_68;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"description","");
          iVar3 = (**(code **)(paVar6->_M_allocated_capacity + 0x10))
                            (paVar6,(string *)local_78,&local_128);
          if (local_78[0] != local_68) {
            operator_delete(local_78[0],local_68[0] + 1);
          }
          if ((char)iVar3 != '\0') {
            addValueName(local_f8,iVar2,&local_150,&local_128);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_128._M_dataplus._M_p != &local_128.field_2) {
            operator_delete(local_128._M_dataplus._M_p,
                            CONCAT71(local_128.field_2._M_allocated_capacity._1_7_,
                                     local_128.field_2._M_local_buf[0]) + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_150._M_dataplus._M_p != &local_150.field_2) {
            operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
          }
          if (local_130 !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0) {
            (**(code **)(local_130->_M_allocated_capacity + 8))();
          }
        }
        (**(code **)(local_100->_M_allocated_capacity + 0x18))(&local_150);
        paVar6 = local_100;
        local_100 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_150._M_dataplus._M_p;
        local_150._M_dataplus._M_p = (pointer)0x0;
        if ((paVar6 != (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)0x0) &&
           ((**(code **)(paVar6->_M_allocated_capacity + 8))(),
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)local_150._M_dataplus._M_p !=
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)0x0)) {
          (**(code **)(*(size_type *)local_150._M_dataplus._M_p + 8))();
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_170._M_dataplus._M_p != &local_170.field_2) {
        operator_delete(local_170._M_dataplus._M_p,local_170.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_190._M_dataplus._M_p != &local_190.field_2) {
        operator_delete(local_190._M_dataplus._M_p,local_190.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
        operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity + 1);
      }
      if (local_108 !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        (**(code **)(local_108->_M_allocated_capacity + 8))();
      }
    }
    (**(code **)(local_f0->_M_allocated_capacity + 0x18))(&local_1b0);
    paVar6 = local_f0;
    local_f0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)local_1b0._M_dataplus._M_p;
    local_1b0._M_dataplus._M_p = (pointer)0x0;
    if ((paVar6 != (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)0x0) &&
       ((**(code **)(paVar6->_M_allocated_capacity + 8))(),
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)local_1b0._M_dataplus._M_p !=
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)0x0)) {
      (**(code **)(*(size_type *)local_1b0._M_dataplus._M_p + 8))();
    }
  } while (local_f0 !=
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)0x0);
  iVar2 = std::__cxx11::string::compare((char *)&local_e0);
  pDVar11 = local_f8;
  if ((iVar2 == 0) ||
     ((iVar2 = std::__cxx11::string::compare((char *)&local_e0), iVar2 == 0 &&
      (iVar2 = std::__cxx11::string::compare((char *)&local_c0), iVar2 < 0)))) {
    pDVar9 = (local_e8->_M_t).
             super___uniq_ptr_impl<FIX::DOMDocument,_std::default_delete<FIX::DOMDocument>_>._M_t.
             super__Tuple_impl<0UL,_FIX::DOMDocument_*,_std::default_delete<FIX::DOMDocument>_>.
             super__Head_base<0UL,_FIX::DOMDocument_*,_false>._M_head_impl;
    local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b0,"/fix/header","");
    (*pDVar9->_vptr_DOMDocument[5])(&local_150,pDVar9,&local_1b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
      operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_150._M_dataplus._M_p ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      pCVar5 = (ConfigError *)__cxa_allocate_exception(0x50);
      local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_1b0,"<header> section not found in data dictionary","");
      ConfigError::ConfigError(pCVar5,&local_1b0);
      __cxa_throw(pCVar5,&ConfigError::typeinfo,FIX::Exception::~Exception);
    }
    (**(code **)(*(size_type *)local_150._M_dataplus._M_p + 0x10))(&local_128);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128._M_dataplus._M_p ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      pCVar5 = (ConfigError *)__cxa_allocate_exception(0x50);
      local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_1b0,"No header fields defined","");
      ConfigError::ConfigError(pCVar5,&local_1b0);
      __cxa_throw(pCVar5,&ConfigError::typeinfo,FIX::Exception::~Exception);
    }
    do {
      (**(code **)(*(size_type *)local_128._M_dataplus._M_p + 0x28))(&local_1b0);
      iVar2 = std::__cxx11::string::compare((char *)&local_1b0);
      if (iVar2 == 0) {
        bVar12 = true;
      }
      else {
        (**(code **)(*(size_type *)local_128._M_dataplus._M_p + 0x28))(&local_190);
        iVar2 = std::__cxx11::string::compare((char *)&local_190);
        bVar12 = iVar2 == 0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_190._M_dataplus._M_p != &local_190.field_2) {
          operator_delete(local_190._M_dataplus._M_p,local_190.field_2._M_allocated_capacity + 1);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
        operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity + 1);
      }
      if (bVar12) {
        (**(code **)(*(size_type *)local_128._M_dataplus._M_p + 0x20))(local_78);
        plVar4 = local_78[0];
        local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
        local_1b0._M_string_length = 0;
        local_1b0.field_2._M_allocated_capacity =
             local_1b0.field_2._M_allocated_capacity & 0xffffffffffffff00;
        local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_190,"name","");
        cVar1 = (**(code **)(*plVar4 + 0x10))(plVar4,&local_190,&local_1b0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_190._M_dataplus._M_p != &local_190.field_2) {
          operator_delete(local_190._M_dataplus._M_p,local_190.field_2._M_allocated_capacity + 1);
        }
        plVar4 = local_78[0];
        if (cVar1 == '\0') {
          pCVar5 = (ConfigError *)__cxa_allocate_exception(0x50);
          local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_190,"<field> does not have a name attribute","");
          ConfigError::ConfigError(pCVar5,&local_190);
          __cxa_throw(pCVar5,&ConfigError::typeinfo,FIX::Exception::~Exception);
        }
        local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
        local_190._M_string_length = 0;
        local_190.field_2._M_allocated_capacity =
             local_190.field_2._M_allocated_capacity & 0xffffffffffffff00;
        local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_170,"required","");
        (**(code **)(*plVar4 + 0x10))(plVar4,&local_170,&local_190);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_170._M_dataplus._M_p != &local_170.field_2) {
          operator_delete(local_170._M_dataplus._M_p,local_170.field_2._M_allocated_capacity + 1);
        }
        pDVar9 = (DOMDocument *)0x1c4896;
        iVar2 = std::__cxx11::string::compare((char *)&local_190);
        if (iVar2 == 0) {
          bVar12 = true;
        }
        else {
          pDVar9 = (DOMDocument *)0x1ce6d1;
          iVar2 = std::__cxx11::string::compare((char *)&local_190);
          bVar12 = iVar2 == 0;
        }
        iVar2 = lookupXMLFieldNumber(pDVar11,pDVar9,&local_1b0);
        addHeaderField(pDVar11,iVar2,bVar12);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_190._M_dataplus._M_p != &local_190.field_2) {
          operator_delete(local_190._M_dataplus._M_p,local_190.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
          operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity + 1);
        }
        if (local_78[0] != (long *)0x0) {
          (**(code **)(*local_78[0] + 8))();
        }
      }
      (**(code **)(*(size_type *)local_128._M_dataplus._M_p + 0x28))(&local_1b0);
      iVar2 = std::__cxx11::string::compare((char *)&local_1b0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
        operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity + 1);
      }
      if (iVar2 == 0) {
        (**(code **)(*(size_type *)local_128._M_dataplus._M_p + 0x20))(&local_170);
        _Var10._M_p = local_170._M_dataplus._M_p;
        local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
        local_1b0._M_string_length = 0;
        local_1b0.field_2._M_allocated_capacity =
             local_1b0.field_2._M_allocated_capacity & 0xffffffffffffff00;
        local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_190,"required","");
        (**(code **)(*(size_type *)_Var10._M_p + 0x10))(_Var10._M_p,&local_190,&local_1b0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_190._M_dataplus._M_p != &local_190.field_2) {
          operator_delete(local_190._M_dataplus._M_p,local_190.field_2._M_allocated_capacity + 1);
        }
        iVar2 = std::__cxx11::string::compare((char *)&local_1b0);
        if (iVar2 == 0) {
          bVar12 = true;
        }
        else {
          iVar2 = std::__cxx11::string::compare((char *)&local_1b0);
          bVar12 = iVar2 == 0;
        }
        _Var10._M_p = local_128._M_dataplus._M_p;
        pDVar9 = (local_e8->_M_t).
                 super___uniq_ptr_impl<FIX::DOMDocument,_std::default_delete<FIX::DOMDocument>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_FIX::DOMDocument_*,_std::default_delete<FIX::DOMDocument>_>.
                 super__Head_base<0UL,_FIX::DOMDocument_*,_false>._M_head_impl;
        local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_190,"_header_","");
        pDVar11 = local_f8;
        addXMLGroup(local_f8,pDVar9,(DOMNode *)_Var10._M_p,&local_190,local_f8,bVar12);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_190._M_dataplus._M_p != &local_190.field_2) {
          operator_delete(local_190._M_dataplus._M_p,local_190.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
          operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_170._M_dataplus._M_p !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          (**(code **)(*(size_type *)local_170._M_dataplus._M_p + 8))();
        }
      }
      (**(code **)(*(size_type *)local_128._M_dataplus._M_p + 0x18))(&local_1b0);
      _Var10._M_p = local_128._M_dataplus._M_p;
      local_128._M_dataplus._M_p = local_1b0._M_dataplus._M_p;
      local_1b0._M_dataplus._M_p = (pointer)0x0;
      if (((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)_Var10._M_p !=
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)0x0) &&
         ((**(code **)(*(size_type *)_Var10._M_p + 8))(),
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)local_1b0._M_dataplus._M_p !=
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)0x0)) {
        (**(code **)(*(size_type *)local_1b0._M_dataplus._M_p + 8))();
      }
    } while ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)local_128._M_dataplus._M_p !=
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_150._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      (**(code **)(*(size_type *)local_150._M_dataplus._M_p + 8))();
    }
  }
  iVar2 = std::__cxx11::string::compare((char *)&local_e0);
  if ((iVar2 == 0) ||
     ((iVar2 = std::__cxx11::string::compare((char *)&local_e0), iVar2 == 0 &&
      (iVar2 = std::__cxx11::string::compare((char *)&local_c0), iVar2 < 0)))) {
    pDVar9 = (local_e8->_M_t).
             super___uniq_ptr_impl<FIX::DOMDocument,_std::default_delete<FIX::DOMDocument>_>._M_t.
             super__Tuple_impl<0UL,_FIX::DOMDocument_*,_std::default_delete<FIX::DOMDocument>_>.
             super__Head_base<0UL,_FIX::DOMDocument_*,_false>._M_head_impl;
    local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b0,"/fix/trailer","");
    (*pDVar9->_vptr_DOMDocument[5])(&local_150,pDVar9,&local_1b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
      operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_150._M_dataplus._M_p ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      pCVar5 = (ConfigError *)__cxa_allocate_exception(0x50);
      local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_1b0,"<trailer> section not found in data dictionary","");
      ConfigError::ConfigError(pCVar5,&local_1b0);
      __cxa_throw(pCVar5,&ConfigError::typeinfo,FIX::Exception::~Exception);
    }
    (**(code **)(*(size_type *)local_150._M_dataplus._M_p + 0x10))(&local_128);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128._M_dataplus._M_p ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      pCVar5 = (ConfigError *)__cxa_allocate_exception(0x50);
      local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_1b0,"No trailer fields defined","");
      ConfigError::ConfigError(pCVar5,&local_1b0);
      __cxa_throw(pCVar5,&ConfigError::typeinfo,FIX::Exception::~Exception);
    }
    do {
      (**(code **)(*(size_type *)local_128._M_dataplus._M_p + 0x28))(&local_1b0);
      iVar2 = std::__cxx11::string::compare((char *)&local_1b0);
      if (iVar2 == 0) {
        bVar12 = true;
      }
      else {
        (**(code **)(*(size_type *)local_128._M_dataplus._M_p + 0x28))(&local_190);
        iVar2 = std::__cxx11::string::compare((char *)&local_190);
        bVar12 = iVar2 == 0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_190._M_dataplus._M_p != &local_190.field_2) {
          operator_delete(local_190._M_dataplus._M_p,local_190.field_2._M_allocated_capacity + 1);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
        operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity + 1);
      }
      if (bVar12) {
        (**(code **)(*(size_type *)local_128._M_dataplus._M_p + 0x20))(local_78);
        plVar4 = local_78[0];
        local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
        local_1b0._M_string_length = 0;
        local_1b0.field_2._M_allocated_capacity =
             local_1b0.field_2._M_allocated_capacity & 0xffffffffffffff00;
        local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_190,"name","");
        cVar1 = (**(code **)(*plVar4 + 0x10))(plVar4,&local_190,&local_1b0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_190._M_dataplus._M_p != &local_190.field_2) {
          operator_delete(local_190._M_dataplus._M_p,local_190.field_2._M_allocated_capacity + 1);
        }
        plVar4 = local_78[0];
        if (cVar1 == '\0') {
          pCVar5 = (ConfigError *)__cxa_allocate_exception(0x50);
          local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_190,"<field> does not have a name attribute","");
          ConfigError::ConfigError(pCVar5,&local_190);
          __cxa_throw(pCVar5,&ConfigError::typeinfo,FIX::Exception::~Exception);
        }
        local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
        local_190._M_string_length = 0;
        local_190.field_2._M_allocated_capacity =
             local_190.field_2._M_allocated_capacity & 0xffffffffffffff00;
        local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_170,"required","");
        (**(code **)(*plVar4 + 0x10))(plVar4,&local_170,&local_190);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_170._M_dataplus._M_p != &local_170.field_2) {
          operator_delete(local_170._M_dataplus._M_p,local_170.field_2._M_allocated_capacity + 1);
        }
        pDVar9 = (DOMDocument *)0x1c4896;
        iVar2 = std::__cxx11::string::compare((char *)&local_190);
        if (iVar2 == 0) {
          bVar12 = true;
        }
        else {
          pDVar9 = (DOMDocument *)0x1ce6d1;
          iVar2 = std::__cxx11::string::compare((char *)&local_190);
          bVar12 = iVar2 == 0;
        }
        iVar2 = lookupXMLFieldNumber(pDVar11,pDVar9,&local_1b0);
        addTrailerField(pDVar11,iVar2,bVar12);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_190._M_dataplus._M_p != &local_190.field_2) {
          operator_delete(local_190._M_dataplus._M_p,local_190.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
          operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity + 1);
        }
        if (local_78[0] != (long *)0x0) {
          (**(code **)(*local_78[0] + 8))();
        }
      }
      (**(code **)(*(size_type *)local_128._M_dataplus._M_p + 0x28))(&local_1b0);
      iVar2 = std::__cxx11::string::compare((char *)&local_1b0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
        operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity + 1);
      }
      if (iVar2 == 0) {
        (**(code **)(*(size_type *)local_128._M_dataplus._M_p + 0x20))(&local_170);
        _Var10._M_p = local_170._M_dataplus._M_p;
        local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
        local_1b0._M_string_length = 0;
        local_1b0.field_2._M_allocated_capacity =
             local_1b0.field_2._M_allocated_capacity & 0xffffffffffffff00;
        local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_190,"required","");
        (**(code **)(*(size_type *)_Var10._M_p + 0x10))(_Var10._M_p,&local_190,&local_1b0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_190._M_dataplus._M_p != &local_190.field_2) {
          operator_delete(local_190._M_dataplus._M_p,local_190.field_2._M_allocated_capacity + 1);
        }
        iVar2 = std::__cxx11::string::compare((char *)&local_1b0);
        if (iVar2 == 0) {
          bVar12 = true;
        }
        else {
          iVar2 = std::__cxx11::string::compare((char *)&local_1b0);
          bVar12 = iVar2 == 0;
        }
        _Var10._M_p = local_128._M_dataplus._M_p;
        pDVar9 = (local_e8->_M_t).
                 super___uniq_ptr_impl<FIX::DOMDocument,_std::default_delete<FIX::DOMDocument>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_FIX::DOMDocument_*,_std::default_delete<FIX::DOMDocument>_>.
                 super__Head_base<0UL,_FIX::DOMDocument_*,_false>._M_head_impl;
        local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_190,"_trailer_","");
        pDVar11 = local_f8;
        addXMLGroup(local_f8,pDVar9,(DOMNode *)_Var10._M_p,&local_190,local_f8,bVar12);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_190._M_dataplus._M_p != &local_190.field_2) {
          operator_delete(local_190._M_dataplus._M_p,local_190.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
          operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_170._M_dataplus._M_p !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          (**(code **)(*(size_type *)local_170._M_dataplus._M_p + 8))();
        }
      }
      (**(code **)(*(size_type *)local_128._M_dataplus._M_p + 0x18))(&local_1b0);
      _Var10._M_p = local_128._M_dataplus._M_p;
      local_128._M_dataplus._M_p = local_1b0._M_dataplus._M_p;
      local_1b0._M_dataplus._M_p = (pointer)0x0;
      if (((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)_Var10._M_p !=
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)0x0) &&
         ((**(code **)(*(size_type *)_Var10._M_p + 8))(),
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)local_1b0._M_dataplus._M_p !=
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)0x0)) {
        (**(code **)(*(size_type *)local_1b0._M_dataplus._M_p + 8))();
      }
    } while ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)local_128._M_dataplus._M_p !=
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_150._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      (**(code **)(*(size_type *)local_150._M_dataplus._M_p + 8))();
    }
  }
  pDVar9 = (local_e8->_M_t).
           super___uniq_ptr_impl<FIX::DOMDocument,_std::default_delete<FIX::DOMDocument>_>._M_t.
           super__Tuple_impl<0UL,_FIX::DOMDocument_*,_std::default_delete<FIX::DOMDocument>_>.
           super__Head_base<0UL,_FIX::DOMDocument_*,_false>._M_head_impl;
  local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b0,"/fix/messages","");
  (*pDVar9->_vptr_DOMDocument[5])(local_78,pDVar9,&local_1b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
    operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity + 1);
  }
  if (local_78[0] == (long *)0x0) {
    pCVar5 = (ConfigError *)__cxa_allocate_exception(0x50);
    local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_1b0,"<messages> section not found in data dictionary","");
    ConfigError::ConfigError(pCVar5,&local_1b0);
    __cxa_throw(pCVar5,&ConfigError::typeinfo,FIX::Exception::~Exception);
  }
  (**(code **)(*local_78[0] + 0x10))(&local_108);
  if (local_108 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    pCVar5 = (ConfigError *)__cxa_allocate_exception(0x50);
    local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b0,"No messages defined","");
    ConfigError::ConfigError(pCVar5,&local_1b0);
    __cxa_throw(pCVar5,&ConfigError::typeinfo,FIX::Exception::~Exception);
  }
  local_38 = (_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)&pDVar11->m_messages;
  local_50 = (FieldToValue *)&pDVar11->m_requiredFields;
  do {
    (**(code **)(local_108->_M_allocated_capacity + 0x28))(&local_1b0);
    iVar2 = std::__cxx11::string::compare((char *)&local_1b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
      operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity + 1);
    }
    if (iVar2 == 0) {
      (**(code **)(local_108->_M_allocated_capacity + 0x20))(&local_100);
      paVar6 = local_100;
      local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
      local_1b0._M_string_length = 0;
      local_1b0.field_2._M_allocated_capacity =
           local_1b0.field_2._M_allocated_capacity & 0xffffffffffffff00;
      local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_190,"msgtype","");
      cVar1 = (**(code **)(paVar6->_M_allocated_capacity + 0x10))(paVar6,&local_190,&local_1b0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_190._M_dataplus._M_p != &local_190.field_2) {
        operator_delete(local_190._M_dataplus._M_p,local_190.field_2._M_allocated_capacity + 1);
      }
      if (cVar1 == '\0') {
        pCVar5 = (ConfigError *)__cxa_allocate_exception(0x50);
        local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_190,"<message> does not have a msgtype attribute","");
        ConfigError::ConfigError(pCVar5,&local_190);
        __cxa_throw(pCVar5,&ConfigError::typeinfo,FIX::Exception::~Exception);
      }
      std::
      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::_M_insert_unique<std::__cxx11::string_const&>(local_38,&local_1b0);
      paVar6 = local_100;
      local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
      local_190._M_string_length = 0;
      local_190.field_2._M_allocated_capacity =
           local_190.field_2._M_allocated_capacity & 0xffffffffffffff00;
      local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_170,"name","");
      cVar1 = (**(code **)(paVar6->_M_allocated_capacity + 0x10))(paVar6,&local_170,&local_190);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_170._M_dataplus._M_p != &local_170.field_2) {
        operator_delete(local_170._M_dataplus._M_p,local_170.field_2._M_allocated_capacity + 1);
      }
      if (cVar1 != '\0') {
        addValueName(local_f8,0x23,&local_1b0,&local_190);
      }
      (**(code **)(local_108->_M_allocated_capacity + 0x10))(&local_130);
      while (local_130 !=
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x0) {
        (**(code **)(local_130->_M_allocated_capacity + 0x28))(&local_170);
        iVar2 = std::__cxx11::string::compare((char *)&local_170);
        if (iVar2 == 0) {
          bVar12 = true;
        }
        else {
          (**(code **)(local_130->_M_allocated_capacity + 0x28))(&local_150);
          iVar2 = std::__cxx11::string::compare((char *)&local_150);
          bVar12 = iVar2 == 0;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_150._M_dataplus._M_p != &local_150.field_2) {
            operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_170._M_dataplus._M_p != &local_170.field_2) {
          operator_delete(local_170._M_dataplus._M_p,local_170.field_2._M_allocated_capacity + 1);
        }
        if (bVar12) {
          (**(code **)(local_130->_M_allocated_capacity + 0x20))(&local_58);
          paVar6 = local_58;
          local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
          local_170._M_string_length = 0;
          local_170.field_2._M_allocated_capacity =
               local_170.field_2._M_allocated_capacity & 0xffffffffffffff00;
          local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_150,"name","");
          pDoc_00 = &local_150;
          iVar2 = (**(code **)(paVar6->_M_allocated_capacity + 0x10))(paVar6,&local_150,&local_170);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_150._M_dataplus._M_p != &local_150.field_2) {
            pDoc_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      (local_150.field_2._M_allocated_capacity + 1);
            operator_delete(local_150._M_dataplus._M_p,(ulong)pDoc_00);
          }
          pDVar11 = local_f8;
          if ((char)iVar2 == '\0') {
            pCVar5 = (ConfigError *)__cxa_allocate_exception(0x50);
            local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_150,"<field> does not have a name attribute","");
            ConfigError::ConfigError(pCVar5,&local_150);
            __cxa_throw(pCVar5,&ConfigError::typeinfo,FIX::Exception::~Exception);
          }
          iVar2 = lookupXMLFieldNumber(local_f8,(DOMDocument *)pDoc_00,&local_170);
          addMsgField(pDVar11,&local_1b0,iVar2);
          paVar6 = local_58;
          local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
          local_150._M_string_length = 0;
          local_150.field_2._M_allocated_capacity =
               local_150.field_2._M_allocated_capacity & 0xffffffffffffff00;
          local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_128,"required","");
          iVar3 = (**(code **)(paVar6->_M_allocated_capacity + 0x10))(paVar6,&local_128,&local_150);
          if ((char)iVar3 == '\0') {
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_128._M_dataplus._M_p != &local_128.field_2) {
              operator_delete(local_128._M_dataplus._M_p,
                              CONCAT71(local_128.field_2._M_allocated_capacity._1_7_,
                                       local_128.field_2._M_local_buf[0]) + 1);
            }
          }
          else {
            iVar3 = std::__cxx11::string::compare((char *)&local_150);
            if (iVar3 == 0) {
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_128._M_dataplus._M_p != &local_128.field_2) {
                operator_delete(local_128._M_dataplus._M_p,
                                CONCAT71(local_128.field_2._M_allocated_capacity._1_7_,
                                         local_128.field_2._M_local_buf[0]) + 1);
              }
            }
            else {
              iVar3 = std::__cxx11::string::compare((char *)&local_150);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_128._M_dataplus._M_p != &local_128.field_2) {
                operator_delete(local_128._M_dataplus._M_p,
                                CONCAT71(local_128.field_2._M_allocated_capacity._1_7_,
                                         local_128.field_2._M_local_buf[0]) + 1);
              }
              if (iVar3 != 0) goto LAB_0015bebe;
            }
            local_128._M_dataplus._M_p._0_4_ = iVar2;
            this_01 = (_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                      std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
                      ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
                                    *)local_50,&local_1b0);
            std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
            _M_insert_unique<int_const&>(this_01,(int *)&local_128);
          }
LAB_0015bebe:
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_150._M_dataplus._M_p != &local_150.field_2) {
            operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
          }
          _Var10._M_p = (pointer)local_58;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_170._M_dataplus._M_p != &local_170.field_2) {
            operator_delete(local_170._M_dataplus._M_p,local_170.field_2._M_allocated_capacity + 1);
            _Var10._M_p = (pointer)local_58;
          }
LAB_0015bf57:
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_Var10._M_p !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0) {
            (**(code **)(*(size_type *)_Var10._M_p + 8))();
          }
        }
        else {
          (**(code **)(local_130->_M_allocated_capacity + 0x28))(&local_170);
          iVar2 = std::__cxx11::string::compare((char *)&local_170);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_170._M_dataplus._M_p != &local_170.field_2) {
            operator_delete(local_170._M_dataplus._M_p,local_170.field_2._M_allocated_capacity + 1);
          }
          if (iVar2 == 0) {
            (**(code **)(local_130->_M_allocated_capacity + 0x20))(&local_128);
            _Var10._M_p = local_128._M_dataplus._M_p;
            local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
            local_170._M_string_length = 0;
            local_170.field_2._M_allocated_capacity =
                 local_170.field_2._M_allocated_capacity & 0xffffffffffffff00;
            local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_150,"required","");
            (**(code **)(*(size_type *)_Var10._M_p + 0x10))(_Var10._M_p,&local_150,&local_170);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_150._M_dataplus._M_p != &local_150.field_2) {
              operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1
                             );
            }
            iVar2 = std::__cxx11::string::compare((char *)&local_170);
            if (iVar2 == 0) {
              bVar12 = true;
            }
            else {
              iVar2 = std::__cxx11::string::compare((char *)&local_170);
              bVar12 = iVar2 == 0;
            }
            addXMLComponentFields
                      (local_f8,(local_e8->_M_t).
                                super___uniq_ptr_impl<FIX::DOMDocument,_std::default_delete<FIX::DOMDocument>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_FIX::DOMDocument_*,_std::default_delete<FIX::DOMDocument>_>
                                .super__Head_base<0UL,_FIX::DOMDocument_*,_false>._M_head_impl,
                       (DOMNode *)&local_130->_M_allocated_capacity,&local_1b0,local_f8,bVar12);
            _Var10._M_p = local_128._M_dataplus._M_p;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_170._M_dataplus._M_p != &local_170.field_2) {
              operator_delete(local_170._M_dataplus._M_p,local_170.field_2._M_allocated_capacity + 1
                             );
              _Var10._M_p = local_128._M_dataplus._M_p;
            }
            goto LAB_0015bf57;
          }
        }
        (**(code **)(local_130->_M_allocated_capacity + 0x28))(&local_170);
        iVar2 = std::__cxx11::string::compare((char *)&local_170);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_170._M_dataplus._M_p != &local_170.field_2) {
          operator_delete(local_170._M_dataplus._M_p,local_170.field_2._M_allocated_capacity + 1);
        }
        if (iVar2 == 0) {
          (**(code **)(local_130->_M_allocated_capacity + 0x20))(&local_128);
          _Var10._M_p = local_128._M_dataplus._M_p;
          local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
          local_170._M_string_length = 0;
          local_170.field_2._M_allocated_capacity =
               local_170.field_2._M_allocated_capacity & 0xffffffffffffff00;
          local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_150,"required","");
          (**(code **)(*(size_type *)_Var10._M_p + 0x10))(_Var10._M_p,&local_150,&local_170);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_150._M_dataplus._M_p != &local_150.field_2) {
            operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
          }
          iVar2 = std::__cxx11::string::compare((char *)&local_170);
          if (iVar2 == 0) {
            bVar12 = true;
          }
          else {
            iVar2 = std::__cxx11::string::compare((char *)&local_170);
            bVar12 = iVar2 == 0;
          }
          addXMLGroup(local_f8,(local_e8->_M_t).
                               super___uniq_ptr_impl<FIX::DOMDocument,_std::default_delete<FIX::DOMDocument>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_FIX::DOMDocument_*,_std::default_delete<FIX::DOMDocument>_>
                               .super__Head_base<0UL,_FIX::DOMDocument_*,_false>._M_head_impl,
                      (DOMNode *)&local_130->_M_allocated_capacity,&local_1b0,local_f8,bVar12);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_170._M_dataplus._M_p != &local_170.field_2) {
            operator_delete(local_170._M_dataplus._M_p,local_170.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_128._M_dataplus._M_p !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0) {
            (**(code **)(*(size_type *)local_128._M_dataplus._M_p + 8))();
          }
        }
        (**(code **)(local_130->_M_allocated_capacity + 0x18))(&local_170);
        paVar6 = local_130;
        local_130 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_170._M_dataplus._M_p;
        local_170._M_dataplus._M_p = (pointer)0x0;
        if ((paVar6 != (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)0x0) &&
           ((**(code **)(paVar6->_M_allocated_capacity + 8))(),
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)local_170._M_dataplus._M_p !=
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)0x0)) {
          (**(code **)(*(size_type *)local_170._M_dataplus._M_p + 8))();
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_190._M_dataplus._M_p != &local_190.field_2) {
        operator_delete(local_190._M_dataplus._M_p,local_190.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
        operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity + 1);
      }
      if (local_100 !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        (**(code **)(local_100->_M_allocated_capacity + 8))();
      }
    }
    (**(code **)(local_108->_M_allocated_capacity + 0x18))(&local_1b0);
    paVar6 = local_108;
    local_108 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1b0._M_dataplus._M_p;
    local_1b0._M_dataplus._M_p = (pointer)0x0;
    if ((paVar6 != (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)0x0) &&
       ((**(code **)(paVar6->_M_allocated_capacity + 8))(),
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)local_1b0._M_dataplus._M_p !=
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)0x0)) {
      (**(code **)(*(size_type *)local_1b0._M_dataplus._M_p + 8))();
    }
    if (local_108 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      if (local_78[0] != (long *)0x0) {
        (**(code **)(*local_78[0] + 8))();
      }
      if (local_f0 !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        (**(code **)(local_f0->_M_allocated_capacity + 8))();
      }
      if (local_48 != (long *)0x0) {
        (**(code **)(*local_48 + 8))();
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
        operator_delete(local_a0._M_dataplus._M_p,
                        CONCAT71(local_a0.field_2._M_allocated_capacity._1_7_,
                                 local_a0.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
        operator_delete(local_c0._M_dataplus._M_p,
                        CONCAT71(local_c0.field_2._M_allocated_capacity._1_7_,
                                 local_c0.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
        operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
      }
      if (local_80 != (long *)0x0) {
        (**(code **)(*local_80 + 8))();
      }
      if (local_40 != (long *)0x0) {
        (**(code **)(*local_40 + 8))();
      }
      return;
    }
  } while( true );
}

Assistant:

EXCEPT(ConfigError) {
  // VERSION
  DOMNodePtr pFixNode = pDoc->getNode("/fix");
  if (!pFixNode.get()) {
    throw ConfigError("Could not parse data dictionary file"
                      ", or no <fix> node found at root");
  }
  DOMAttributesPtr attrs = pFixNode->getAttributes();
  std::string type = "FIX";
  if (attrs->get("type", type)) {
    if (type != "FIX" && type != "FIXT") {
      throw ConfigError("type attribute must be FIX or FIXT");
    }
  }
  std::string major;
  if (!attrs->get("major", major)) {
    throw ConfigError("major attribute not found on <fix>");
  }
  std::string minor;
  if (!attrs->get("minor", minor)) {
    throw ConfigError("minor attribute not found on <fix>");
  }
  setVersion(type + "." + major + "." + minor);

  // FIELDS
  DOMNodePtr pFieldsNode = pDoc->getNode("/fix/fields");
  if (!pFieldsNode.get()) {
    throw ConfigError("<fields> section not found in data dictionary");
  }

  DOMNodePtr pFieldNode = pFieldsNode->getFirstChildNode();
  if (!pFieldNode.get()) {
    throw ConfigError("No fields defined");
  }

  while (pFieldNode.get()) {
    if (pFieldNode->getName() == "field") {
      DOMAttributesPtr attrs = pFieldNode->getAttributes();
      std::string name;
      if (!attrs->get("name", name)) {
        throw ConfigError("<field> does not have a name attribute");
      }
      std::string number;
      if (!attrs->get("number", number)) {
        throw ConfigError("<field> " + name + " does not have a number attribute");
      }
      int num = atoi(number.c_str());
      std::string type;
      if (!attrs->get("type", type)) {
        throw ConfigError("<field> " + name + " does not have a type attribute");
      }
      addField(num);
      addFieldType(num, XMLTypeToType(type));
      addFieldName(num, name);

      DOMNodePtr pFieldValueNode = pFieldNode->getFirstChildNode();
      while (pFieldValueNode.get()) {
        if (pFieldValueNode->getName() == "value") {
          DOMAttributesPtr attrs = pFieldValueNode->getAttributes();
          std::string enumeration;
          if (!attrs->get("enum", enumeration)) {
            throw ConfigError("<value> does not have enum attribute in field " + name);
          }
          addFieldValue(num, enumeration);
          std::string description;
          if (attrs->get("description", description)) {
            addValueName(num, enumeration, description);
          }
        }
        RESET_AUTO_PTR(pFieldValueNode, pFieldValueNode->getNextSiblingNode());
      }
    }
    RESET_AUTO_PTR(pFieldNode, pFieldNode->getNextSiblingNode());
  }

  // HEADER
  if (type == "FIXT" || (type == "FIX" && major < "5")) {
    DOMNodePtr pHeaderNode = pDoc->getNode("/fix/header");
    if (!pHeaderNode.get()) {
      throw ConfigError("<header> section not found in data dictionary");
    }

    DOMNodePtr pHeaderFieldNode = pHeaderNode->getFirstChildNode();
    if (!pHeaderFieldNode.get()) {
      throw ConfigError("No header fields defined");
    }

    while (pHeaderFieldNode.get()) {
      if (pHeaderFieldNode->getName() == "field" || pHeaderFieldNode->getName() == "group") {
        DOMAttributesPtr attrs = pHeaderFieldNode->getAttributes();
        std::string name;
        if (!attrs->get("name", name)) {
          throw ConfigError("<field> does not have a name attribute");
        }
        std::string required;
        attrs->get("required", required);
        bool isRequired = (required == "Y" || required == "y");
        addHeaderField(lookupXMLFieldNumber(pDoc.get(), name), isRequired);
      }
      if (pHeaderFieldNode->getName() == "group") {
        DOMAttributesPtr attrs = pHeaderFieldNode->getAttributes();
        std::string required;
        attrs->get("required", required);
        bool isRequired = (required == "Y" || required == "y");
        addXMLGroup(pDoc.get(), pHeaderFieldNode.get(), "_header_", *this, isRequired);
      }

      RESET_AUTO_PTR(pHeaderFieldNode, pHeaderFieldNode->getNextSiblingNode());
    }
  }

  // TRAILER
  if (type == "FIXT" || (type == "FIX" && major < "5")) {
    DOMNodePtr pTrailerNode = pDoc->getNode("/fix/trailer");
    if (!pTrailerNode.get()) {
      throw ConfigError("<trailer> section not found in data dictionary");
    }

    DOMNodePtr pTrailerFieldNode = pTrailerNode->getFirstChildNode();
    if (!pTrailerFieldNode.get()) {
      throw ConfigError("No trailer fields defined");
    }

    while (pTrailerFieldNode.get()) {
      if (pTrailerFieldNode->getName() == "field" || pTrailerFieldNode->getName() == "group") {
        DOMAttributesPtr attrs = pTrailerFieldNode->getAttributes();
        std::string name;
        if (!attrs->get("name", name)) {
          throw ConfigError("<field> does not have a name attribute");
        }
        std::string required;
        attrs->get("required", required);
        bool isRequired = (required == "Y" || required == "y");
        addTrailerField(lookupXMLFieldNumber(pDoc.get(), name), isRequired);
      }
      if (pTrailerFieldNode->getName() == "group") {
        DOMAttributesPtr attrs = pTrailerFieldNode->getAttributes();
        std::string required;
        attrs->get("required", required);
        bool isRequired = (required == "Y" || required == "y");
        addXMLGroup(pDoc.get(), pTrailerFieldNode.get(), "_trailer_", *this, isRequired);
      }

      RESET_AUTO_PTR(pTrailerFieldNode, pTrailerFieldNode->getNextSiblingNode());
    }
  }

  // MSGTYPE
  DOMNodePtr pMessagesNode = pDoc->getNode("/fix/messages");
  if (!pMessagesNode.get()) {
    throw ConfigError("<messages> section not found in data dictionary");
  }

  DOMNodePtr pMessageNode = pMessagesNode->getFirstChildNode();
  if (!pMessageNode.get()) {
    throw ConfigError("No messages defined");
  }

  while (pMessageNode.get()) {
    if (pMessageNode->getName() == "message") {
      DOMAttributesPtr attrs = pMessageNode->getAttributes();
      std::string msgtype;
      if (!attrs->get("msgtype", msgtype)) {
        throw ConfigError("<message> does not have a msgtype attribute");
      }
      addMsgType(msgtype);

      std::string name;
      if (attrs->get("name", name)) {
        addValueName(35, msgtype, name);
      }

      DOMNodePtr pMessageFieldNode = pMessageNode->getFirstChildNode();
      while (pMessageFieldNode.get()) {
        if (pMessageFieldNode->getName() == "field" || pMessageFieldNode->getName() == "group") {
          DOMAttributesPtr attrs = pMessageFieldNode->getAttributes();
          std::string name;
          if (!attrs->get("name", name)) {
            throw ConfigError("<field> does not have a name attribute");
          }
          int num = lookupXMLFieldNumber(pDoc.get(), name);
          addMsgField(msgtype, num);

          std::string required;
          if (attrs->get("required", required) && (required == "Y" || required == "y")) {
            addRequiredField(msgtype, num);
          }
        } else if (pMessageFieldNode->getName() == "component") {
          DOMAttributesPtr attrs = pMessageFieldNode->getAttributes();
          std::string required;
          attrs->get("required", required);
          bool isRequired = (required == "Y" || required == "y");
          addXMLComponentFields(pDoc.get(), pMessageFieldNode.get(), msgtype, *this, isRequired);
        }
        if (pMessageFieldNode->getName() == "group") {
          DOMAttributesPtr attrs = pMessageFieldNode->getAttributes();
          std::string required;
          attrs->get("required", required);
          bool isRequired = (required == "Y" || required == "y");
          addXMLGroup(pDoc.get(), pMessageFieldNode.get(), msgtype, *this, isRequired);
        }
        RESET_AUTO_PTR(pMessageFieldNode, pMessageFieldNode->getNextSiblingNode());
      }
    }
    RESET_AUTO_PTR(pMessageNode, pMessageNode->getNextSiblingNode());
  }
}